

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

QNode * despot::DESPOT::Prune(QNode *qnode,double *pruned_value)

{
  QNode *this;
  int edge;
  QNode *pQVar1;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar2;
  VNode *this_00;
  mapped_type *ppVVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  double dVar6;
  ValuedAction VVar7;
  double nu;
  ACT_TYPE astar;
  double local_60;
  QNode *local_58;
  QNode *local_50;
  double *local_48;
  double local_40;
  ACT_TYPE local_34;
  
  pQVar1 = (QNode *)operator_new(0x88);
  edge = QNode::edge(qnode);
  QNode::QNode(pQVar1,(VNode *)0x0,edge);
  *pruned_value = qnode->step_reward - DAT_00193df0;
  local_58 = pQVar1;
  local_50 = qnode;
  pmVar2 = QNode::children(qnode);
  p_Var4 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    local_48 = pruned_value;
    do {
      this_00 = Prune((VNode *)p_Var4[1]._M_parent,&local_34,&local_60);
      local_40 = local_60;
      VVar7 = VNode::default_move((VNode *)p_Var4[1]._M_parent);
      pQVar1 = local_58;
      if ((local_40 != VVar7.value) || (NAN(local_40) || NAN(VVar7.value))) {
        pmVar2 = QNode::children(local_58);
        pruned_value = local_48;
        ppVVar3 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](pmVar2,(key_type *)(p_Var4 + 1));
        *ppVVar3 = this_00;
        VNode::parent(this_00,pQVar1);
      }
      else {
        VNode::~VNode(this_00);
        operator_delete(this_00,0x98);
      }
      *pruned_value = local_60 + *pruned_value;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  this = local_50;
  dVar6 = QNode::lower_bound(local_50);
  pQVar1 = local_58;
  QNode::lower_bound(local_58,dVar6);
  dVar6 = QNode::upper_bound(this);
  QNode::upper_bound(pQVar1,dVar6);
  return pQVar1;
}

Assistant:

QNode* DESPOT::Prune(QNode* qnode, double& pruned_value) {
	QNode* pruned_q = new QNode((VNode*) NULL, qnode->edge());
	pruned_value = qnode->step_reward - Globals::config.pruning_constant;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		ACT_TYPE astar;
		double nu;
		VNode* pruned_v = Prune(it->second, astar, nu);
		if (nu == it->second->default_move().value) {
			delete pruned_v;
		} else {
			pruned_q->children()[it->first] = pruned_v;
			pruned_v->parent(pruned_q);
		}
		pruned_value += nu;
	}

	pruned_q->lower_bound(qnode->lower_bound()); // for debugging
	pruned_q->upper_bound(qnode->upper_bound()); // for debugging

	return pruned_q;
}